

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O2

void __thiscall
QLCDNumberPrivate::drawDigit
          (QLCDNumberPrivate *this,QPoint *pos,QPainter *p,int segLen,char newCh,char oldCh)

{
  char cVar1;
  bool erase;
  char *pcVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  char updates [18] [2];
  undefined8 local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaa;
  pcVar2 = getSegments(oldCh);
  uVar7 = 0;
  while( true ) {
    cVar1 = pcVar2[uVar7];
    if (cVar1 == 'c') break;
    *(undefined1 *)((long)&local_68 + uVar7 * 2) = 0;
    *(char *)((long)&local_68 + uVar7 * 2 + 1) = cVar1;
    uVar7 = uVar7 + 1;
  }
  pcVar2 = getSegments(newCh);
  lVar3 = 0;
  uVar5 = uVar7 & 0xffffffff;
  while( true ) {
    cVar1 = pcVar2[lVar3];
    iVar4 = (int)uVar5;
    if (cVar1 == 'c') break;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      if (cVar1 == *(char *)((long)&local_68 + uVar6 * 2 + 1)) {
        *(undefined1 *)((long)&local_68 + uVar6 * 2) = 2;
        if (uVar7 != uVar6) goto LAB_003e8f07;
        break;
      }
    }
    *(undefined1 *)((long)&local_68 + (long)iVar4 * 2) = 1;
    *(char *)((long)&local_68 + (long)iVar4 * 2 + 1) = cVar1;
    uVar5 = (ulong)(iVar4 + 1);
LAB_003e8f07:
    lVar3 = lVar3 + 1;
  }
  uVar7 = 0;
  if (iVar4 < 1) {
    uVar5 = 0;
  }
  do {
    if (uVar5 == uVar7) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    cVar1 = *(char *)((long)&local_68 + uVar7 * 2);
    if (cVar1 == '\x01') {
      erase = false;
LAB_003e8f2e:
      drawSegment(this,pos,*(char *)((long)&local_68 + uVar7 * 2 + 1),p,segLen,erase);
    }
    else if (cVar1 == '\0') {
      erase = true;
      goto LAB_003e8f2e;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void QLCDNumberPrivate::drawDigit(const QPoint &pos, QPainter &p, int segLen,
                                  char newCh, char oldCh)
{
// Draws and/or erases segments to change display of a single digit
// from oldCh to newCh

    char updates[18][2];        // can hold 2 times number of segments, only
                                // first 9 used if segment table is correct
    int  nErases;
    int  nUpdates;
    const char *segs;
    int  i,j;

    const char erase      = 0;
    const char draw       = 1;
    const char leaveAlone = 2;

    segs = getSegments(oldCh);
    for (nErases=0; segs[nErases] != 99; nErases++) {
        updates[nErases][0] = erase;            // get segments to erase to
        updates[nErases][1] = segs[nErases];    // remove old char
    }
    nUpdates = nErases;
    segs = getSegments(newCh);
    for(i = 0 ; segs[i] != 99 ; i++) {
        for (j=0;  j<nErases; j++)
            if (segs[i] == updates[j][1]) {   // same segment ?
                updates[j][0] = leaveAlone;     // yes, already on screen
                break;
            }
        if (j == nErases) {                   // if not already on screen
            updates[nUpdates][0] = draw;
            updates[nUpdates][1] = segs[i];
            nUpdates++;
        }
    }
    for (i=0; i<nUpdates; i++) {
        if (updates[i][0] == draw)
            drawSegment(pos, updates[i][1], p, segLen);
        if (updates[i][0] == erase)
            drawSegment(pos, updates[i][1], p, segLen, true);
    }
}